

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_attribute_corner_table.cc
# Opt level: O0

int __thiscall
draco::MeshAttributeCornerTable::ConfidentValence(MeshAttributeCornerTable *this,VertexIndex v)

{
  bool bVar1;
  undefined4 in_ESI;
  int valence;
  VertexRingIterator<draco::MeshAttributeCornerTable> vi;
  undefined4 in_stack_ffffffffffffffd0;
  int iVar2;
  VertexRingIterator<draco::MeshAttributeCornerTable> *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  VertexIndex in_stack_ffffffffffffffe4;
  
  VertexRingIterator<draco::MeshAttributeCornerTable>::VertexRingIterator
            (in_stack_ffffffffffffffd8,
             (MeshAttributeCornerTable *)CONCAT44(in_ESI,in_stack_ffffffffffffffd0),
             in_stack_ffffffffffffffe4);
  iVar2 = 0;
  while( true ) {
    bVar1 = VertexRingIterator<draco::MeshAttributeCornerTable>::End
                      ((VertexRingIterator<draco::MeshAttributeCornerTable> *)0x19116a);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    iVar2 = iVar2 + 1;
    VertexRingIterator<draco::MeshAttributeCornerTable>::Next
              ((VertexRingIterator<draco::MeshAttributeCornerTable> *)
               CONCAT44(in_stack_ffffffffffffffe4.value_,in_stack_ffffffffffffffe0));
  }
  return iVar2;
}

Assistant:

int MeshAttributeCornerTable::ConfidentValence(VertexIndex v) const {
  DRACO_DCHECK_LT(v.value(), num_vertices());
  draco::VertexRingIterator<MeshAttributeCornerTable> vi(this, v);
  int valence = 0;
  for (; !vi.End(); vi.Next()) {
    ++valence;
  }
  return valence;
}